

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::AggregateOptionFinder::FindExtension
          (AggregateOptionFinder *this,Message *message,string *name)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar5;
  ulong uVar6;
  Symbol SVar7;
  long lVar3;
  
  assert_mutex_held(this->builder_->pool_);
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  lVar3 = CONCAT44(extraout_var,iVar2);
  SVar7 = LookupSymbolNoPlaceholder(this->builder_,name,*(string **)(lVar3 + 8),LOOKUP_ALL);
  aVar5 = SVar7.field_1;
  if (SVar7.type == MESSAGE) {
    if (*(char *)(*(long *)(lVar3 + 0x20) + 0x58) == '\x01') {
      uVar4 = 0;
      uVar6 = (ulong)*(uint *)(aVar5.descriptor + 0x68);
      if ((int)*(uint *)(aVar5.descriptor + 0x68) < 1) {
        uVar6 = uVar4;
      }
      for (; uVar6 * 0x78 - uVar4 != 0; uVar4 = uVar4 + 0x78) {
        lVar1 = *(long *)(aVar5.descriptor + 0x70);
        if ((((*(long *)(lVar1 + 0x38 + uVar4) == lVar3) && (*(int *)(lVar1 + 0x2c + uVar4) == 0xb))
            && (*(int *)(lVar1 + 0x30 + uVar4) == 1)) &&
           (*(FieldDescriptor **)(lVar1 + 0x48 + uVar4) == (FieldDescriptor *)aVar5.descriptor)) {
          return (FieldDescriptor *)(lVar1 + uVar4);
        }
      }
    }
  }
  else if ((SVar7.type == FIELD) &&
          (*(FieldDescriptor *)(aVar5.descriptor + 0x34) != (FieldDescriptor)0x0)) {
    return (FieldDescriptor *)aVar5.descriptor;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

virtual const FieldDescriptor* FindExtension(
      Message* message, const string& name) const {
    assert_mutex_held(builder_->pool_);
    const Descriptor* descriptor = message->GetDescriptor();
    Symbol result = builder_->LookupSymbolNoPlaceholder(
        name, descriptor->full_name());
    if (result.type == Symbol::FIELD &&
        result.field_descriptor->is_extension()) {
      return result.field_descriptor;
    } else if (result.type == Symbol::MESSAGE &&
               descriptor->options().message_set_wire_format()) {
      const Descriptor* foreign_type = result.descriptor;
      // The text format allows MessageSet items to be specified using
      // the type name, rather than the extension identifier. If the symbol
      // lookup returned a Message, and the enclosing Message has
      // message_set_wire_format = true, then return the message set
      // extension, if one exists.
      for (int i = 0; i < foreign_type->extension_count(); i++) {
        const FieldDescriptor* extension = foreign_type->extension(i);
        if (extension->containing_type() == descriptor &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            extension->is_optional() &&
            extension->message_type() == foreign_type) {
          // Found it.
          return extension;
        }
      }
    }
    return NULL;
  }